

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

int hash_table_insert_value(unsigned_long hash,long value,hash_table_t *hash_table)

{
  hash_table_entry_t *phVar1;
  ulong uVar2;
  hash_table_entry_t *phVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  phVar1 = hash_table->entries;
  uVar2 = hash_table->capacity;
  uVar4 = hash % uVar2;
  uVar6 = 1;
  uVar5 = uVar4;
  while( true ) {
    if (phVar1[uVar5].filled == 0) {
      phVar3 = phVar1 + uVar5;
      phVar3->hash = hash;
      phVar3->filled = 1;
      phVar3->value = value;
      if (uVar5 != uVar4) {
        phVar3->next = phVar1[uVar4].next;
        phVar1[uVar4].next = phVar3;
      }
      return 0;
    }
    if (uVar2 <= uVar6) break;
    uVar5 = (uVar6 * uVar6 + uVar4) % uVar2;
    uVar6 = uVar6 + 1;
  }
  return 1;
}

Assistant:

static int hash_table_insert_value(unsigned long hash, long value, hash_table_t* hash_table)
{
  /* Insert value */
  size_t start_index = hash % hash_table->capacity;
  size_t index = start_index;
  hash_table_entry_t* start_entry = hash_table->entries + start_index;
  size_t i;
  hash_table_entry_t* entry;

  for (i = 1; hash_table->entries[index].filled; i++)
  {
    if (i >= hash_table->capacity)
      return HASH_TABLE_ERROR;
    index = (start_index + (i * i)) % hash_table->capacity;
  }

  entry = hash_table->entries + index;
  entry->hash = hash;
  entry->filled = 1;
  entry->value = value;

  if (index != start_index) {
    /* This is a new entry, but not the start entry, hence we need to add a next pointer to our entry */
    entry->next = start_entry->next;
    start_entry->next = entry;
  }

  return HASH_TABLE_SUCCESS;
}